

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void sub192(uint64_t a0,uint64_t a1,uint64_t a2,uint64_t b0,uint64_t b1,uint64_t b2,uint64_t *z0Ptr,
           uint64_t *z1Ptr,uint64_t *z2Ptr)

{
  int8_t borrow1;
  int8_t borrow0;
  uint64_t z2;
  uint64_t z1;
  uint64_t z0;
  uint64_t b2_local;
  uint64_t b1_local;
  uint64_t b0_local;
  uint64_t a2_local;
  uint64_t a1_local;
  uint64_t a0_local;
  
  *z2Ptr = a2 - b2;
  *z1Ptr = (a1 - b1) - (long)(a2 < b2);
  *z0Ptr = ((a0 - b0) - (long)(int)(uint)(a1 - b1 < (ulong)(long)(a2 < b2))) - (long)(a1 < b1);
  return;
}

Assistant:

static inline void
 sub192(
     uint64_t a0,
     uint64_t a1,
     uint64_t a2,
     uint64_t b0,
     uint64_t b1,
     uint64_t b2,
     uint64_t *z0Ptr,
     uint64_t *z1Ptr,
     uint64_t *z2Ptr
 )
{
    uint64_t z0, z1, z2;
    int8_t borrow0, borrow1;

    z2 = a2 - b2;
    borrow1 = ( a2 < b2 );
    z1 = a1 - b1;
    borrow0 = ( a1 < b1 );
    z0 = a0 - b0;
    z0 -= ( z1 < borrow1 );
    z1 -= borrow1;
    z0 -= borrow0;
    *z2Ptr = z2;
    *z1Ptr = z1;
    *z0Ptr = z0;

}